

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_stristr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_54;
  int before;
  sxi32 rc;
  sxu32 nOfft;
  int nPatLen;
  int nLen;
  char *zPattern;
  char *zBlob;
  ProcStringMatch xPatternMatch;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zBlob = (char *)iPatternMatch;
  xPatternMatch = (ProcStringMatch)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zPattern = jx9_value_to_string(*apArg,(int *)&nOfft);
    _nPatLen = jx9_value_to_string(*(jx9_value **)(xPatternMatch + 8),&rc);
    before = 0;
    if (((int)nOfft < 1) || (rc < 1)) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      local_54 = 0;
      iVar1 = (*(code *)zBlob)(zPattern,nOfft,_nPatLen,rc,&before);
      if (iVar1 == 0) {
        if (2 < apArg_local._4_4_) {
          local_54 = jx9_value_to_int(*(jx9_value **)(xPatternMatch + 0x10));
        }
        if (local_54 == 0) {
          jx9_result_string(pjStack_18,zPattern + (uint)before,nOfft - before);
        }
        else {
          jx9_result_string(pjStack_18,zPattern,before);
        }
      }
      else {
        jx9_result_bool(pjStack_18,0);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_stristr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	ProcStringMatch xPatternMatch = iPatternMatch; /* Case-insensitive pattern match */
	const char *zBlob, *zPattern;
	int nLen, nPatLen;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	nOfft = 0; /* cc warning */
	if( nLen > 0 && nPatLen > 0 ){
		int before = 0;
		/* Perform the lookup */
		rc = xPatternMatch(zBlob, (sxu32)nLen, zPattern, (sxu32)nPatLen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the portion of the string */
		if( nArg > 2 ){
			before = jx9_value_to_int(apArg[2]);
		}
		if( before ){
			jx9_result_string(pCtx, zBlob, (int)(&zBlob[nOfft]-zBlob));
		}else{
			jx9_result_string(pCtx, &zBlob[nOfft], (int)(&zBlob[nLen]-&zBlob[nOfft]));
		}
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}